

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::DeepScanLineOutputFile::Data::~Data(Data *this)

{
  size_type sVar1;
  reference ppLVar2;
  reference ppOVar3;
  long in_RDI;
  size_t i_1;
  size_t i;
  value_type in_stack_ffffffffffffffc0;
  LineBuffer *in_stack_ffffffffffffffd0;
  ulong local_18;
  ulong local_10;
  
  for (local_10 = 0;
      sVar1 = std::
              vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
              ::size((vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                      *)(in_RDI + 0x128)), local_10 < sVar1; local_10 = local_10 + 1) {
    ppLVar2 = std::
              vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
              ::operator[]((vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                            *)(in_RDI + 0x128),local_10);
    if (*ppLVar2 != (value_type)0x0) {
      ppLVar2 = std::
                vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                ::operator[]((vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                              *)(in_RDI + 0x128),local_10);
      in_stack_ffffffffffffffd0 = *ppLVar2;
      if (in_stack_ffffffffffffffd0 != (LineBuffer *)0x0) {
        anon_unknown_6::LineBuffer::~LineBuffer(in_stack_ffffffffffffffd0);
        operator_delete(in_stack_ffffffffffffffd0,200);
      }
    }
  }
  for (local_18 = 0;
      sVar1 = std::
              vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
              ::size((vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
                      *)(in_RDI + 0x108)), local_18 < sVar1; local_18 = local_18 + 1) {
    ppOVar3 = std::
              vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
              ::operator[]((vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
                            *)(in_RDI + 0x108),local_18);
    in_stack_ffffffffffffffc0 = *ppOVar3;
    if (in_stack_ffffffffffffffc0 != (value_type)0x0) {
      operator_delete(in_stack_ffffffffffffffc0,0x38);
    }
  }
  Array<unsigned_int>::~Array((Array<unsigned_int> *)in_stack_ffffffffffffffc0);
  std::
  vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
  ::~vector((vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
             *)in_stack_ffffffffffffffd0);
  std::
  vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
  ::~vector((vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
             *)in_stack_ffffffffffffffd0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffd0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffd0);
  DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1ad7bd);
  Header::~Header((Header *)in_stack_ffffffffffffffd0);
  return;
}

Assistant:

DeepScanLineOutputFile::Data::~Data ()
{
    for (size_t i = 0; i < lineBuffers.size (); i++)
        if (lineBuffers[i] != 0) delete lineBuffers[i];

    for (size_t i = 0; i < slices.size (); i++)
        delete slices[i];
}